

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patternparser.cpp
# Opt level: O0

void __thiscall
PatternParser::parseFixedPattern
          (PatternParser *this,Pattern *pattern,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokenList)

{
  Pattern *pPVar1;
  bool bVar2;
  size_type sVar3;
  InputError *pIVar4;
  string local_118 [36];
  int local_f4;
  double dStack_f0;
  int i;
  double factor;
  string local_e0 [32];
  int local_c0;
  allocator local_b9;
  int interval;
  string s2;
  allocator local_91;
  string local_90 [32];
  Pattern *local_70;
  FixedPattern *fixedPat;
  string *tokens;
  allocator local_49;
  string local_48 [36];
  int local_24;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_20;
  int nTokens;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tokenList_local;
  Pattern *pattern_local;
  PatternParser *this_local;
  
  pvStack_20 = tokenList;
  tokenList_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)pattern;
  pattern_local = (Pattern *)this;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(tokenList);
  local_24 = (int)sVar3;
  if (local_24 < 2) {
    tokens._3_1_ = 1;
    pIVar4 = (InputError *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"",&local_49);
    InputError::InputError(pIVar4,2,(string *)local_48);
    tokens._3_1_ = 0;
    __cxa_throw(pIVar4,&InputError::typeinfo,InputError::~InputError);
  }
  fixedPat = (FixedPattern *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](pvStack_20,0);
  local_70 = (Pattern *)tokenList_local;
  pPVar1 = &fixedPat->super_Pattern;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"FIXED",&local_91);
  bVar2 = Utilities::match((string *)&(pPVar1->super_Element).field_0x20,(string *)local_90);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  if (bVar2) {
    if (2 < local_24) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&interval,"",&local_b9);
      std::allocator<char>::~allocator((allocator<char> *)&local_b9);
      local_c0 = Utilities::getSeconds
                           ((string *)
                            &(fixedPat->super_Pattern).factors.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,(string *)&interval);
      if (local_c0 < 1) {
        factor._7_1_ = 1;
        pIVar4 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  (local_e0,(string *)
                            &(fixedPat->super_Pattern).factors.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage);
        InputError::InputError(pIVar4,7,(string *)local_e0);
        factor._7_1_ = 0;
        __cxa_throw(pIVar4,&InputError::typeinfo,InputError::~InputError);
      }
      Pattern::setTimeInterval(local_70,local_c0);
      std::__cxx11::string::~string((string *)&interval);
    }
  }
  else {
    for (local_f4 = 1; local_f4 < local_24; local_f4 = local_f4 + 1) {
      bVar2 = Utilities::parseNumber<double>
                        ((string *)
                         (&(fixedPat->super_Pattern).super_Element._vptr_Element +
                         (long)local_f4 * 4),&stack0xffffffffffffff10);
      if (!bVar2) {
        pIVar4 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  (local_118,
                   (string *)
                   (&(fixedPat->super_Pattern).super_Element._vptr_Element + (long)local_f4 * 4));
        InputError::InputError(pIVar4,6,(string *)local_118);
        __cxa_throw(pIVar4,&InputError::typeinfo,InputError::~InputError);
      }
      Pattern::addFactor(local_70,dStack_f0);
    }
  }
  return;
}

Assistant:

void PatternParser::parseFixedPattern(Pattern* pattern, vector<string>& tokenList)
{
    // Formats are:
    //     PatternName  FIXED  (interval)
    //     PatternName  factor1  factor2  ...

    // ... check for enough tokens

    int nTokens = tokenList.size();
    if ( nTokens < 2 ) throw InputError(InputError::TOO_FEW_ITEMS, "");
    string* tokens = &tokenList[0];

    // ... cast pattern to FixedPattern

    FixedPattern* fixedPat = static_cast<FixedPattern*>(pattern);

    // ... check if next token is the pattern type keyword

    if ( Utilities::match(tokens[1], "FIXED") )
    {
        // check if next token is the pattern interval

        if ( nTokens > 2 )
        {
            string s2 = "";
            int interval = Utilities::getSeconds(tokens[2], s2);
            if ( interval <= 0 ) throw InputError(InputError::INVALID_TIME, tokens[2]);
            fixedPat->setTimeInterval(interval);

        }
        return;
    }

    // ... read in pattern factors

    double factor;
    int i = 1;
    while ( i < nTokens )
    {
        if ( !Utilities::parseNumber(tokens[i], factor) )
        {
            throw InputError(InputError::INVALID_NUMBER, tokens[i]);
        }
        fixedPat->addFactor(factor);
        i++;
    }
}